

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

uint8_t nibble(char c)

{
  uint __line;
  byte bVar1;
  char *__assertion;
  
  if (c < 'a') {
    if (c < 'A') {
      bVar1 = c - 0x30;
      if (9 < bVar1) {
        __assertion = "c >= \'0\' && c <= \'9\'";
        __line = 0x26;
        goto LAB_0010c8d4;
      }
    }
    else {
      if (0x46 < (byte)c) {
        __assertion = "c <= \'F\'";
        __line = 0x23;
LAB_0010c8d4:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                      ,__line,"nibble");
      }
      bVar1 = c - 0x37;
    }
  }
  else {
    if (0x66 < (byte)c) {
      __assertion = "c <= \'f\'";
      __line = 0x20;
      goto LAB_0010c8d4;
    }
    bVar1 = c + 0xa9;
  }
  return bVar1;
}

Assistant:

constexpr uint8_t nibble(char c) {
	if (c >= 'a') {
		assert(c <= 'f');
		return c - 'a' + 10;
	} else if (c >= 'A') {
		assert(c <= 'F');
		return c - 'A' + 10;
	} else {
		assert(c >= '0' && c <= '9');
		return c - '0';
	}
}